

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUIComboBox * __thiscall
irr::gui::CGUIEnvironment::addComboBox
          (CGUIEnvironment *this,rect<int> *rectangle,IGUIElement *parent,s32 id)

{
  int *piVar1;
  long lVar2;
  CGUIComboBox *this_00;
  IGUIElement *parent_00;
  
  this_00 = (CGUIComboBox *)operator_new(0x1b0);
  parent_00 = (IGUIElement *)&(this->super_IGUIEnvironment).field_0x8;
  if (parent != (IGUIElement *)0x0) {
    parent_00 = parent;
  }
  CGUIComboBox::CGUIComboBox(this_00,&this->super_IGUIEnvironment,parent_00,id,*rectangle);
  lVar2 = *(long *)(*(long *)this_00 + -0x18);
  piVar1 = (int *)(&this_00->field_0x10 + lVar2);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
  }
  return (IGUIComboBox *)this_00;
}

Assistant:

IGUIComboBox *CGUIEnvironment::addComboBox(const core::rect<s32> &rectangle,
		IGUIElement *parent, s32 id)
{
	IGUIComboBox *t = new CGUIComboBox(this, parent ? parent : this,
			id, rectangle);
	t->drop();
	return t;
}